

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3UniqueConstraint(Parse *pParse,int onError,Index *pIdx)

{
  Table *pTVar1;
  char *pcVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  StrAccum local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pTVar1 = pIdx->pTable;
  local_58.db = pParse->db;
  local_58.mxAlloc = (local_58.db)->aLimit[0];
  local_58.zText = (char *)0x0;
  local_58.nAlloc = 0;
  local_58.nChar = 0;
  local_58.accError = '\0';
  local_58.printfFlags = '\0';
  local_58._30_2_ = 0xaaaa;
  if (pIdx->aColExpr == (ExprList *)0x0) {
    if (pIdx->nKeyCol != 0) {
      uVar3 = 0;
      do {
        pcVar2 = pTVar1->aCol[pIdx->aiColumn[uVar3]].zCnName;
        if (uVar3 != 0) {
          if (local_58.nChar + 2 < local_58.nAlloc) {
            (local_58.zText + local_58.nChar)[0] = ',';
            (local_58.zText + local_58.nChar)[1] = ' ';
            local_58.nChar = local_58.nChar + 2;
          }
          else {
            enlargeAndAppend(&local_58,", ",2);
          }
        }
        sqlite3_str_appendall(&local_58,pTVar1->zName);
        if (local_58.nChar + 1 < local_58.nAlloc) {
          local_58.zText[local_58.nChar] = '.';
          local_58.nChar = local_58.nChar + 1;
        }
        else {
          enlargeAndAppend(&local_58,".",1);
        }
        sqlite3_str_appendall(&local_58,pcVar2);
        uVar3 = uVar3 + 1;
      } while (uVar3 < pIdx->nKeyCol);
    }
  }
  else {
    sqlite3_str_appendf(&local_58,"index \'%q\'",pIdx->zName);
  }
  pcVar2 = sqlite3StrAccumFinish(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    sqlite3HaltConstraint
              (pParse,(uint)((*(ushort *)&pIdx->field_0x63 & 3) != 2) * 0x200 + 0x613,onError,pcVar2
               ,-6,'\x02');
    return;
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_PRIVATE void sqlite3UniqueConstraint(
  Parse *pParse,    /* Parsing context */
  int onError,      /* Constraint type */
  Index *pIdx       /* The index that triggers the constraint */
){
  char *zErr;
  int j;
  StrAccum errMsg;
  Table *pTab = pIdx->pTable;

  sqlite3StrAccumInit(&errMsg, pParse->db, 0, 0,
                      pParse->db->aLimit[SQLITE_LIMIT_LENGTH]);
  if( pIdx->aColExpr ){
    sqlite3_str_appendf(&errMsg, "index '%q'", pIdx->zName);
  }else{
    for(j=0; j<pIdx->nKeyCol; j++){
      char *zCol;
      assert( pIdx->aiColumn[j]>=0 );
      zCol = pTab->aCol[pIdx->aiColumn[j]].zCnName;
      if( j ) sqlite3_str_append(&errMsg, ", ", 2);
      sqlite3_str_appendall(&errMsg, pTab->zName);
      sqlite3_str_append(&errMsg, ".", 1);
      sqlite3_str_appendall(&errMsg, zCol);
    }
  }
  zErr = sqlite3StrAccumFinish(&errMsg);
  sqlite3HaltConstraint(pParse,
    IsPrimaryKeyIndex(pIdx) ? SQLITE_CONSTRAINT_PRIMARYKEY
                            : SQLITE_CONSTRAINT_UNIQUE,
    onError, zErr, P4_DYNAMIC, P5_ConstraintUnique);
}